

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunator.hpp
# Opt level: O2

void __thiscall
delaunator::Delaunator::Delaunator
          (Delaunator *this,vector<double,_std::allocator<double>_> *in_coords)

{
  ulong uVar1;
  _Iter_comp_iter<delaunator::compare> __comp;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  Delaunator *this_01;
  size_type sVar2;
  pointer puVar3;
  size_t sVar4;
  unsigned_long uVar5;
  size_t sVar6;
  size_t sVar7;
  pointer puVar8;
  runtime_error *this_02;
  double *pdVar9;
  vector<double,_std::allocator<double>_> *pvVar10;
  vector<double,_std::allocator<double>_> *pvVar11;
  ulong uVar12;
  pointer pdVar13;
  Delaunator *pDVar14;
  pointer puVar15;
  ulong uVar16;
  vector<double,_std::allocator<double>_> *pvVar17;
  size_t i;
  vector<double,_std::allocator<double>_> *pvVar18;
  size_t i0;
  long lVar19;
  vector<double,_std::allocator<double>_> *pvVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auStack_f8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> ids;
  vector<double,_std::allocator<double>_> *local_d8;
  pair<double,_double> pStack_d0;
  double local_c0;
  double local_b8;
  double local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_98;
  double local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_78;
  vector<double,_std::allocator<double>_> *local_70;
  vector<double,_std::allocator<double>_> *local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  Delaunator *local_38;
  
  this->coords = in_coords;
  local_a8 = &this->triangles;
  local_a0 = &this->halfedges;
  local_78 = &this->hull_prev;
  local_88 = &this->hull_next;
  local_80 = &this->hull_tri;
  local_98 = &this->m_hash;
  memset(local_a8,0,200);
  pvVar17 = (vector<double,_std::allocator<double>_> *)
            ((long)(in_coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(in_coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  local_68 = (vector<double,_std::allocator<double>_> *)((ulong)pvVar17 >> 1);
  auStack_f8 = (undefined1  [8])0x0;
  ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_f8,(size_type)local_68
            );
  dVar25 = 2.2250738585072014e-308;
  dVar27 = 1.79769313486232e+308;
  local_48 = 1.79769313486232e+308;
  dVar23 = 2.2250738585072014e-308;
  for (local_d8 = (vector<double,_std::allocator<double>_> *)0x0; local_d8 < local_68;
      local_d8 = (vector<double,_std::allocator<double>_> *)
                 ((long)&(local_d8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
    pdVar13 = (this->coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_90 = pdVar13[(long)local_d8 * 2 + 1];
    local_60 = local_48;
    local_58 = dVar25;
    local_50 = dVar23;
    local_48 = pdVar13[(long)local_d8 * 2];
    local_40 = dVar27;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_f8,
               (value_type_conflict2 *)&local_d8);
    dVar25 = local_90;
    if (local_90 <= local_58) {
      dVar25 = local_58;
    }
    dVar23 = local_48;
    if (local_48 <= local_50) {
      dVar23 = local_50;
    }
    dVar27 = local_90;
    if (local_40 <= local_90) {
      dVar27 = local_40;
    }
    if (local_60 <= local_48) {
      local_48 = local_60;
    }
  }
  pdVar13 = (this->coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pdVar9 = pdVar13 + 1;
  dVar22 = 1.79769313486232e+308;
  pvVar20 = (vector<double,_std::allocator<double>_> *)0xffffffffffffffff;
  for (pvVar10 = (vector<double,_std::allocator<double>_> *)0x0; local_68 != pvVar10;
      pvVar10 = (vector<double,_std::allocator<double>_> *)
                ((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + 1)) {
    dVar24 = (local_48 + dVar23) * 0.5 - pdVar9[-1];
    dVar26 = (dVar27 + dVar25) * 0.5 - *pdVar9;
    dVar24 = dVar24 * dVar24 + dVar26 * dVar26;
    pvVar11 = pvVar10;
    if (dVar22 <= dVar24) {
      dVar24 = dVar22;
      pvVar11 = pvVar20;
    }
    pvVar20 = pvVar11;
    dVar22 = dVar24;
    pdVar9 = pdVar9 + 2;
  }
  local_60 = pdVar13[(long)pvVar20 * 2];
  local_58 = pdVar13[(long)pvVar20 * 2 + 1];
  pdVar9 = pdVar13 + 1;
  dVar25 = 1.79769313486232e+308;
  pvVar10 = (vector<double,_std::allocator<double>_> *)0xffffffffffffffff;
  for (pvVar11 = (vector<double,_std::allocator<double>_> *)0x0; local_68 != pvVar11;
      pvVar11 = (vector<double,_std::allocator<double>_> *)
                ((long)&(pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + 1)) {
    if (((pvVar20 != pvVar11) &&
        (dVar23 = (local_60 - pdVar9[-1]) * (local_60 - pdVar9[-1]) +
                  (local_58 - *pdVar9) * (local_58 - *pdVar9), dVar23 < dVar25)) && (0.0 < dVar23))
    {
      pvVar10 = pvVar11;
      dVar25 = dVar23;
    }
    pdVar9 = pdVar9 + 2;
  }
  dVar25 = pdVar13[(long)pvVar10 * 2];
  dVar23 = pdVar13[(long)pvVar10 * 2 + 1];
  local_40 = 1.79769313486232e+308;
  pvVar11 = (vector<double,_std::allocator<double>_> *)0xffffffffffffffff;
  lVar19 = 8;
  local_70 = pvVar17;
  local_50 = dVar25;
  local_48 = dVar23;
  for (pvVar18 = (vector<double,_std::allocator<double>_> *)0x0; this_00 = local_98,
      local_68 != pvVar18;
      pvVar18 = (vector<double,_std::allocator<double>_> *)
                ((long)&(pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + 1)) {
    if ((pvVar10 != pvVar18 && pvVar20 != pvVar18) &&
       (pdVar13 = (local_38->coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start,
       dVar27 = circumradius(local_60,local_58,dVar25,dVar23,
                             *(double *)((long)pdVar13 + lVar19 + -8),
                             *(double *)((long)pdVar13 + lVar19)), dVar25 = local_50,
       dVar23 = local_48, dVar27 < local_40)) {
      pvVar11 = pvVar18;
      local_40 = dVar27;
    }
    lVar19 = lVar19 + 0x10;
  }
  if (1.79769313486232e+308 <= local_40) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"not triangulation");
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pdVar13 = (local_38->coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_b8 = pdVar13[(long)pvVar11 * 2];
  local_b0 = pdVar13[(long)pvVar11 * 2 + 1];
  pvVar17 = pvVar10;
  local_90 = dVar25;
  local_c0 = dVar23;
  if ((local_b8 - dVar25) * (dVar23 - local_58) - (local_b0 - dVar23) * (dVar25 - local_60) < 0.0) {
    pvVar17 = pvVar11;
    pvVar11 = pvVar10;
    local_90 = local_b8;
    local_c0 = local_b0;
    local_b8 = dVar25;
    local_b0 = dVar23;
  }
  pStack_d0 = circumcenter(local_60,local_58,local_90,local_c0,local_b8,local_b0);
  local_38->m_center_x = pStack_d0.first;
  local_38->m_center_y = pStack_d0.second;
  local_d8 = local_38->coords;
  __comp._M_comp.cx = pStack_d0.first;
  __comp._M_comp.coords = local_d8;
  __comp._M_comp.cy = pStack_d0.second;
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<delaunator::compare>>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )auStack_f8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,__comp);
  dVar25 = ceil(SQRT((double)(long)local_68));
  sVar2 = llround(dVar25);
  local_38->m_hash_size = sVar2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,sVar2);
  pvVar10 = local_68;
  puVar8 = (local_38->m_hash).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (local_38->m_hash).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar8; puVar3 = puVar3 + 1) {
    *puVar3 = 0xffffffffffffffff;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_78,(size_type)local_68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_88,(size_type)pvVar10);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_80,(size_type)pvVar10);
  pDVar14 = local_38;
  local_38->hull_start = (size_t)pvVar20;
  puVar3 = (local_38->hull_prev).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3[(long)pvVar11] = (unsigned_long)pvVar17;
  puVar8 = (local_38->hull_next).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar8[(long)pvVar20] = (unsigned_long)pvVar17;
  puVar3[(long)pvVar20] = (unsigned_long)pvVar11;
  puVar8[(long)pvVar17] = (unsigned_long)pvVar11;
  puVar3[(long)pvVar17] = (unsigned_long)pvVar20;
  puVar8[(long)pvVar11] = (unsigned_long)pvVar20;
  puVar3 = (local_38->hull_tri).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3[(long)pvVar20] = 0;
  puVar3[(long)pvVar17] = 1;
  puVar3[(long)pvVar11] = 2;
  sVar4 = hash_key(local_38,local_60,local_58);
  (pDVar14->m_hash).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[sVar4] = (unsigned_long)pvVar20;
  sVar4 = hash_key(pDVar14,local_90,local_c0);
  (pDVar14->m_hash).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[sVar4] = (unsigned_long)pvVar17;
  sVar4 = hash_key(pDVar14,local_b8,local_b0);
  (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[sVar4] = (unsigned_long)pvVar11;
  sVar2 = 3;
  if ((vector<double,_std::allocator<double>_> *)0x5 < local_70) {
    sVar2 = ((ulong)local_70 & 0xfffffffffffffffe) * 3 - 0xf;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(local_a8,sVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(local_a0,sVar2);
  add_triangle(local_38,(size_t)pvVar20,(size_t)pvVar17,(size_t)pvVar11,0xffffffffffffffff,
               0xffffffffffffffff,0xffffffffffffffff);
  dVar23 = NAN;
  pvVar17 = (vector<double,_std::allocator<double>_> *)0x0;
  dVar25 = NAN;
  pDVar14 = local_38;
  pvVar20 = local_68;
  do {
    if (pvVar17 == pvVar20) {
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_f8);
      return;
    }
    dVar24 = *(double *)((long)auStack_f8 + pvVar17 * 8);
    pdVar13 = (pDVar14->coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    dVar27 = pdVar13[(long)dVar24 * 2];
    dVar22 = pdVar13[(long)dVar24 * 2 + 1];
    if ((((pvVar17 == (vector<double,_std::allocator<double>_> *)0x0) ||
         (2.220446049250313e-16 < ABS(dVar27 - dVar23))) ||
        (2.220446049250313e-16 < ABS(dVar22 - dVar25))) &&
       (((dVar25 = dVar22, dVar23 = dVar27, 2.220446049250313e-16 < ABS(dVar27 - local_60) ||
         (2.220446049250313e-16 < ABS(dVar22 - local_58))) &&
        (((2.220446049250313e-16 < ABS(dVar27 - local_90) ||
          (2.220446049250313e-16 < ABS(dVar22 - local_c0))) &&
         ((2.220446049250313e-16 < ABS(dVar27 - local_b8) ||
          (2.220446049250313e-16 < ABS(dVar22 - local_b0))))))))) {
      local_50 = dVar22;
      local_48 = dVar27;
      sVar4 = hash_key(pDVar14,dVar27,dVar22);
      this_01 = local_38;
      uVar1 = pDVar14->m_hash_size;
      puVar3 = (pDVar14->hull_next).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = 0;
      uVar16 = uVar1;
      while (bVar21 = uVar16 != 0, uVar16 = uVar16 - 1, bVar21) {
        uVar12 = sVar4;
        if (uVar1 <= sVar4) {
          uVar12 = sVar4 % uVar1;
        }
        uVar5 = (pDVar14->m_hash).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar12];
        if ((uVar5 != 0xffffffffffffffff) && (uVar5 != puVar3[uVar5])) break;
        sVar4 = sVar4 + 1;
      }
      sVar4 = (pDVar14->hull_prev).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar5];
      pdVar13 = (pDVar14->coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      i0 = sVar4;
      do {
        sVar6 = puVar3[i0];
        pDVar14 = local_38;
        dVar25 = local_50;
        dVar23 = local_48;
        local_40 = dVar24;
        if ((pdVar13[sVar6 * 2] - pdVar13[i0 * 2]) * (pdVar13[i0 * 2 + 1] - local_50) -
            (pdVar13[sVar6 * 2 + 1] - pdVar13[i0 * 2 + 1]) * (pdVar13[i0 * 2] - local_48) < 0.0) {
          if (i0 != 0xffffffffffffffff) {
            local_70 = pvVar17;
            sVar6 = add_triangle(local_38,i0,(size_t)dVar24,sVar6,0xffffffffffffffff,
                                 0xffffffffffffffff,
                                 (local_38->hull_tri).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[i0]);
            sVar7 = legalize(this_01,sVar6 + 2);
            puVar3 = (local_80->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            puVar3[(long)local_40] = sVar7;
            puVar3[i0] = sVar6;
            puVar8 = (local_88->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            uVar5 = puVar8[i0];
            while( true ) {
              pDVar14 = local_38;
              sVar6 = puVar8[uVar5];
              pdVar13 = (local_38->coords->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              if (0.0 <= (pdVar13[sVar6 * 2] - pdVar13[uVar5 * 2]) *
                         (pdVar13[uVar5 * 2 + 1] - local_50) -
                         (pdVar13[sVar6 * 2 + 1] - pdVar13[uVar5 * 2 + 1]) *
                         (pdVar13[uVar5 * 2] - local_48)) break;
              sVar7 = add_triangle(local_38,uVar5,(size_t)local_40,sVar6,puVar3[(long)local_40],
                                   0xffffffffffffffff,puVar3[uVar5]);
              sVar7 = legalize(pDVar14,sVar7 + 2);
              puVar3 = (local_80->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar3[(long)local_40] = sVar7;
              puVar8 = (local_88->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar8[uVar5] = uVar5;
              uVar5 = sVar6;
            }
            if (i0 == sVar4) {
              while( true ) {
                i0 = sVar4;
                puVar15 = (local_78->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start;
                sVar4 = puVar15[i0];
                if (0.0 <= (pdVar13[i0 * 2] - pdVar13[sVar4 * 2]) *
                           (pdVar13[sVar4 * 2 + 1] - local_50) -
                           (pdVar13[i0 * 2 + 1] - pdVar13[sVar4 * 2 + 1]) *
                           (pdVar13[sVar4 * 2] - local_48)) break;
                sVar6 = add_triangle(pDVar14,sVar4,(size_t)local_40,i0,0xffffffffffffffff,puVar3[i0]
                                     ,puVar3[sVar4]);
                legalize(pDVar14,sVar6 + 2);
                puVar3 = (pDVar14->hull_tri).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                puVar3[sVar4] = sVar6;
                puVar8 = (pDVar14->hull_next).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                puVar8[i0] = i0;
                pdVar13 = (pDVar14->coords->super__Vector_base<double,_std::allocator<double>_>).
                          _M_impl.super__Vector_impl_data._M_start;
              }
            }
            else {
              puVar15 = (local_78->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        )._M_impl.super__Vector_impl_data._M_start;
            }
            pDVar14 = local_38;
            dVar25 = local_40;
            pvVar17 = local_70;
            puVar15[(long)local_40] = i0;
            local_38->hull_start = i0;
            puVar15[uVar5] = (unsigned_long)local_40;
            puVar8[i0] = (unsigned_long)local_40;
            puVar8[(long)local_40] = uVar5;
            sVar4 = hash_key(local_38,local_48,local_50);
            (pDVar14->m_hash).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[sVar4] = (unsigned_long)dVar25;
            pdVar13 = (pDVar14->coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            sVar4 = hash_key(pDVar14,pdVar13[i0 * 2],pdVar13[i0 * 2 + 1]);
            (local_98->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[sVar4] = i0;
            pvVar20 = local_68;
            dVar25 = local_50;
            dVar23 = local_48;
          }
          break;
        }
        i0 = sVar6;
      } while (sVar6 != sVar4);
    }
    pvVar17 = (vector<double,_std::allocator<double>_> *)
              ((long)&(pvVar17->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

Delaunator::Delaunator(std::vector<double> const& in_coords)
    : coords(in_coords),
      triangles(),
      halfedges(),
      hull_prev(),
      hull_next(),
      hull_tri(),
      hull_start(),
      m_hash(),
      m_center_x(),
      m_center_y(),
      m_hash_size(),
      m_edge_stack() {
    std::size_t n = coords.size() >> 1;

    double max_x = std::numeric_limits<double>::min();
    double max_y = std::numeric_limits<double>::min();
    double min_x = std::numeric_limits<double>::max();
    double min_y = std::numeric_limits<double>::max();
    std::vector<std::size_t> ids;
    ids.reserve(n);

    for (std::size_t i = 0; i < n; i++) {
        const double x = coords[2 * i];
        const double y = coords[2 * i + 1];

        if (x < min_x) min_x = x;
        if (y < min_y) min_y = y;
        if (x > max_x) max_x = x;
        if (y > max_y) max_y = y;

        ids.push_back(i);
    }
    const double cx = (min_x + max_x) / 2;
    const double cy = (min_y + max_y) / 2;
    double min_dist = std::numeric_limits<double>::max();

    std::size_t i0 = INVALID_INDEX;
    std::size_t i1 = INVALID_INDEX;
    std::size_t i2 = INVALID_INDEX;

    // pick a seed point close to the centroid
    for (std::size_t i = 0; i < n; i++) {
        const double d = dist(cx, cy, coords[2 * i], coords[2 * i + 1]);
        if (d < min_dist) {
            i0 = i;
            min_dist = d;
        }
    }

    const double i0x = coords[2 * i0];
    const double i0y = coords[2 * i0 + 1];

    min_dist = std::numeric_limits<double>::max();

    // find the point closest to the seed
    for (std::size_t i = 0; i < n; i++) {
        if (i == i0) continue;
        const double d = dist(i0x, i0y, coords[2 * i], coords[2 * i + 1]);
        if (d < min_dist && d > 0.0) {
            i1 = i;
            min_dist = d;
        }
    }

    double i1x = coords[2 * i1];
    double i1y = coords[2 * i1 + 1];

    double min_radius = std::numeric_limits<double>::max();

    // find the third point which forms the smallest circumcircle with the first two
    for (std::size_t i = 0; i < n; i++) {
        if (i == i0 || i == i1) continue;

        const double r = circumradius(
            i0x, i0y, i1x, i1y, coords[2 * i], coords[2 * i + 1]);

        if (r < min_radius) {
            i2 = i;
            min_radius = r;
        }
    }

    if (!(min_radius < std::numeric_limits<double>::max())) {
        throw std::runtime_error("not triangulation");
    }

    double i2x = coords[2 * i2];
    double i2y = coords[2 * i2 + 1];

    if (orient(i0x, i0y, i1x, i1y, i2x, i2y)) {
        std::swap(i1, i2);
        std::swap(i1x, i2x);
        std::swap(i1y, i2y);
    }

    std::tie(m_center_x, m_center_y) = circumcenter(i0x, i0y, i1x, i1y, i2x, i2y);

    // sort the points by distance from the seed triangle circumcenter
    std::sort(ids.begin(), ids.end(), compare{ coords, m_center_x, m_center_y });

    // initialize a hash table for storing edges of the advancing convex hull
    m_hash_size = static_cast<std::size_t>(std::llround(std::ceil(std::sqrt(n))));
    m_hash.resize(m_hash_size);
    std::fill(m_hash.begin(), m_hash.end(), INVALID_INDEX);

    // initialize arrays for tracking the edges of the advancing convex hull
    hull_prev.resize(n);
    hull_next.resize(n);
    hull_tri.resize(n);

    hull_start = i0;

    size_t hull_size = 3;

    hull_next[i0] = hull_prev[i2] = i1;
    hull_next[i1] = hull_prev[i0] = i2;
    hull_next[i2] = hull_prev[i1] = i0;

    hull_tri[i0] = 0;
    hull_tri[i1] = 1;
    hull_tri[i2] = 2;

    m_hash[hash_key(i0x, i0y)] = i0;
    m_hash[hash_key(i1x, i1y)] = i1;
    m_hash[hash_key(i2x, i2y)] = i2;

    std::size_t max_triangles = n < 3 ? 1 : 2 * n - 5;
    triangles.reserve(max_triangles * 3);
    halfedges.reserve(max_triangles * 3);
    add_triangle(i0, i1, i2, INVALID_INDEX, INVALID_INDEX, INVALID_INDEX);
    double xp = std::numeric_limits<double>::quiet_NaN();
    double yp = std::numeric_limits<double>::quiet_NaN();
    for (std::size_t k = 0; k < n; k++) {
        const std::size_t i = ids[k];
        const double x = coords[2 * i];
        const double y = coords[2 * i + 1];

        // skip near-duplicate points
        if (k > 0 && check_pts_equal(x, y, xp, yp)) continue;
        xp = x;
        yp = y;

        // skip seed triangle points
        if (
            check_pts_equal(x, y, i0x, i0y) ||
            check_pts_equal(x, y, i1x, i1y) ||
            check_pts_equal(x, y, i2x, i2y)) continue;

        // find a visible edge on the convex hull using edge hash
        std::size_t start = 0;

        size_t key = hash_key(x, y);
        for (size_t j = 0; j < m_hash_size; j++) {
            start = m_hash[fast_mod(key + j, m_hash_size)];
            if (start != INVALID_INDEX && start != hull_next[start]) break;
        }

        start = hull_prev[start];
        size_t e = start;
        size_t q;

        while (q = hull_next[e], !orient(x, y, coords[2 * e], coords[2 * e + 1], coords[2 * q], coords[2 * q + 1])) { //TODO: does it works in a same way as in JS
            e = q;
            if (e == start) {
                e = INVALID_INDEX;
                break;
            }
        }

        if (e == INVALID_INDEX) continue; // likely a near-duplicate point; skip it

        // add the first triangle from the point
        std::size_t t = add_triangle(
            e,
            i,
            hull_next[e],
            INVALID_INDEX,
            INVALID_INDEX,
            hull_tri[e]);

        hull_tri[i] = legalize(t + 2);
        hull_tri[e] = t;
        hull_size++;

        // walk forward through the hull, adding more triangles and flipping recursively
        std::size_t next = hull_next[e];
        while (
            q = hull_next[next],
            orient(x, y, coords[2 * next], coords[2 * next + 1], coords[2 * q], coords[2 * q + 1])) {
            t = add_triangle(next, i, q, hull_tri[i], INVALID_INDEX, hull_tri[next]);
            hull_tri[i] = legalize(t + 2);
            hull_next[next] = next; // mark as removed
            hull_size--;
            next = q;
        }

        // walk backward from the other side, adding more triangles and flipping
        if (e == start) {
            while (
                q = hull_prev[e],
                orient(x, y, coords[2 * q], coords[2 * q + 1], coords[2 * e], coords[2 * e + 1])) {
                t = add_triangle(q, i, e, INVALID_INDEX, hull_tri[e], hull_tri[q]);
                legalize(t + 2);
                hull_tri[q] = t;
                hull_next[e] = e; // mark as removed
                hull_size--;
                e = q;
            }
        }

        // update the hull indices
        hull_prev[i] = e;
        hull_start = e;
        hull_prev[next] = i;
        hull_next[e] = i;
        hull_next[i] = next;

        m_hash[hash_key(x, y)] = i;
        m_hash[hash_key(coords[2 * e], coords[2 * e + 1])] = e;
    }
}